

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall
Preprocessor::preprocess(Preprocessor *this,QByteArray *filename,Symbols *preprocessed)

{
  qsizetype *index;
  Macros *this_00;
  int iVar1;
  Symbol *pSVar2;
  qsizetype qVar3;
  Data *pDVar4;
  qsizetype qVar5;
  bool bVar6;
  char cVar7;
  Token TVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  stack<QByteArray,_QList<QByteArray>_> *this_01;
  qsizetype i;
  ulong uVar12;
  long in_FS_OFFSET;
  QByteArrayView QVar13;
  SubArray local_f8;
  Symbol sym;
  QArrayDataPointer<Symbol> local_90;
  QByteArrayView local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &(this->super_Parser).currentFilenames;
  QList<QByteArray>::emplaceBack<QByteArray_const&>(&this_01->c,filename);
  QList<Symbol>::reserve(preprocessed,(this->super_Parser).symbols.d.size + (preprocessed->d).size);
  index = &(this->super_Parser).index;
  this_00 = &this->macros;
switchD_0012a1e0_caseD_a4:
  if ((this->super_Parser).symbols.d.size <= (this->super_Parser).index) {
    std::stack<QByteArray,_QList<QByteArray>_>::pop(this_01);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  TVar8 = Parser::next(&this->super_Parser);
  switch(TVar8) {
  case NEWLINE:
    goto switchD_0012a1e0_caseD_a4;
  case PP_WHITESPACE:
  case BACKSLASH:
  case INCOMPLETE:
  case PP_HASHHASH:
    goto switchD_0012a1e0_caseD_a5;
  case PP_DEFINE:
    Parser::next(&this->super_Parser);
    local_58.size = -0x5555555555555556;
    local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    Parser::lexem((QByteArray *)&local_58,&this->super_Parser);
    if ((char *)local_58.size != (char *)0x0) {
      pcVar10 = QByteArray::data((QByteArray *)&local_58);
      bVar6 = is_ident_start(*pcVar10);
      if (bVar6) {
        sym.len = 0;
        sym.lex.d.size = 0;
        sym.from = 0;
        sym.lex.d.d = (Data *)0x0;
        sym.lex.d.ptr = (char *)0x0;
        sym.lineNum = -0x55560000;
        sym.token = 0xaaaaaaaa;
        bVar6 = Parser::test(&this->super_Parser,LPAREN);
        if (bVar6) {
          sym.lineNum._0_1_ = 1;
          parseDefineArguments(this,(Macro *)&sym);
        }
        else {
          sym._0_8_ = (ulong)(uint7)sym._1_7_ << 8;
        }
        uVar12 = (this->super_Parser).index;
        until(this,NEWLINE);
        QList<Symbol>::reserve((QList<Symbol> *)&sym.from,~uVar12 + (this->super_Parser).index);
        lVar11 = uVar12 * 0x30;
        iVar9 = 0x9e;
        for (; (long)uVar12 < *index + -1; uVar12 = uVar12 + 1) {
          pSVar2 = (this->super_Parser).symbols.d.ptr;
          iVar1 = *(int *)((long)&pSVar2->token + lVar11);
          if ((((iVar1 == 0xb1) || (iVar1 != 0xa5)) || (0x14 < iVar9 - 0x9eU)) ||
             ((0x180081U >> (iVar9 - 0x9eU & 0x1f) & 1) == 0)) {
            QList<Symbol>::emplaceBack<Symbol_const&>
                      ((QList<Symbol> *)&sym.from,(Symbol *)((long)&pSVar2->lineNum + lVar11));
            iVar9 = iVar1;
          }
          lVar11 = lVar11 + 0x30;
        }
        SubArray::SubArray(&local_f8,(QByteArray *)&local_58);
        QHash<SubArray,Macro>::emplace<Macro_const&>
                  ((QHash<SubArray,Macro> *)this_00,&local_f8,(Macro *)&sym);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
        Macro::~Macro((Macro *)&sym);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        goto switchD_0012a1e0_caseD_a4;
      }
    }
    Parser::error(&this->super_Parser,(char *)0x0);
  case PP_UNDEF:
    Parser::next(&this->super_Parser);
    local_f8.array.d.size = -0x5555555555555556;
    local_f8.array.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_f8.array.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
    Parser::lexem(&local_f8.array,&this->super_Parser);
    until(this,NEWLINE);
    SubArray::SubArray((SubArray *)&sym,&local_f8.array);
    QHash<SubArray,_Macro>::removeImpl<SubArray>(this_00,(SubArray *)&sym);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&sym);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
    goto switchD_0012a1e0_caseD_a4;
  case PP_IF:
  case PP_IFDEF:
  case PP_IFNDEF:
    do {
      iVar9 = evaluateCondition(this);
      if ((iVar9 != 0) || (bVar6 = skipBranch(this), !bVar6)) goto switchD_0012a1e0_caseD_a4;
      bVar6 = Parser::test(&this->super_Parser,PP_ELIF);
    } while (bVar6);
    break;
  case PP_ELIF:
  case PP_ELSE:
    skipUntilEndif(this);
    break;
  case PP_ENDIF:
  case PP_HASH:
    break;
  case PP_INCLUDE:
    iVar9 = (this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum;
    local_f8.array.d.d = (Data *)0x0;
    local_f8.array.d.ptr = (char *)0x0;
    local_f8.array.d.size = 0;
    bVar6 = Parser::test(&this->super_Parser,PP_STRING_LITERAL);
    if (bVar6) {
      Parser::lexem((QByteArray *)&sym,&this->super_Parser);
      if (sym.lex.d.ptr == (char *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = (char)((sym.lex.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == '\"';
      }
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&sym);
      Parser::unquotedLexem((QByteArray *)&sym,&this->super_Parser);
      qVar3 = local_f8.array.d.size;
      pcVar10 = local_f8.array.d.ptr;
      pDVar4 = local_f8.array.d.d;
      local_f8.array.d.d = (Data *)sym._0_8_;
      local_f8.array.d.ptr = (char *)sym.lex.d.d;
      sym._0_8_ = pDVar4;
      sym.lex.d.d = (Data *)pcVar10;
      local_f8.array.d.size = (qsizetype)sym.lex.d.ptr;
      sym.lex.d.ptr = (char *)qVar3;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&sym);
      until(this,NEWLINE);
      if (bVar6) {
        local_58.d = (filename->d).d;
        local_58.ptr = (filename->d).ptr;
        local_58.size = (filename->d).size;
        if (local_58.d != (Data *)0x0) {
          LOCK();
          ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
      else {
        local_58.d = (Data *)0x0;
        local_58.ptr = (char *)0x0;
        local_58.size = 0;
      }
      resolveInclude((QByteArray *)&sym,this,&local_f8.array,(QByteArray *)&local_58);
      qVar3 = local_f8.array.d.size;
      pcVar10 = local_f8.array.d.ptr;
      pDVar4 = local_f8.array.d.d;
      local_f8.array.d.d = (Data *)sym._0_8_;
      local_f8.array.d.ptr = (char *)sym.lex.d.d;
      sym._0_8_ = pDVar4;
      sym.lex.d.d = (Data *)pcVar10;
      local_f8.array.d.size = (qsizetype)sym.lex.d.ptr;
      sym.lex.d.ptr = (char *)qVar3;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&sym);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      if (((Data *)local_f8.array.d.ptr != (Data *)0x0) &&
         (bVar6 = QHash<QByteArray,_QHashDummyValue>::contains
                            (&(this->preprocessedIncludes).q_hash,&local_f8.array), !bVar6)) {
        QSet<QByteArray>::insert((QSet<QByteArray> *)&sym,(QByteArray *)&this->preprocessedIncludes)
        ;
        local_68 = 0xaaaaaaaaaaaaaaaa;
        uStack_60 = 0xaaaaaaaaaaaaaaaa;
        local_58.d = (Data *)local_f8.array.d.ptr;
        if ((Data *)local_f8.array.d.ptr == (Data *)0x0) {
          local_58.d = (Data *)&QByteArray::_empty;
        }
        QByteArrayView::QByteArrayView<const_char_*,_true>(&local_78,(char **)&local_58);
        QVar13.m_data = (storage_type *)local_78.m_size;
        QVar13.m_size = (qsizetype)&sym;
        QString::fromLocal8Bit(QVar13);
        QFile::QFile((QFile *)&local_68,(QString *)&sym);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&sym);
        cVar7 = QFile::open((QFile *)&local_68,1);
        if (cVar7 != '\0') {
          local_58.size = -0x5555555555555556;
          local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_58.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          readOrMapFile((QByteArray *)&local_58,(QFile *)&local_68);
          QFileDevice::close();
          if ((char *)local_58.size != (char *)0x0) {
            local_90.d = (this->super_Parser).symbols.d.d;
            local_90.ptr = (this->super_Parser).symbols.d.ptr;
            local_90.size = (this->super_Parser).symbols.d.size;
            if (local_90.d != (Data *)0x0) {
              LOCK();
              ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_90.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            qVar3 = (this->super_Parser).index;
            cleaned((QByteArray *)&sym,(QByteArray *)&local_58);
            qVar5 = local_58.size;
            pcVar10 = local_58.ptr;
            pDVar4 = local_58.d;
            local_58.d = (Data *)sym._0_8_;
            local_58.ptr = (char *)sym.lex.d.d;
            sym._0_8_ = pDVar4;
            sym.lex.d.d = (Data *)pcVar10;
            local_58.size = (qsizetype)sym.lex.d.ptr;
            sym.lex.d.ptr = (char *)qVar5;
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&sym);
            tokenize((Symbols *)&sym,(QByteArray *)&local_58,1,TokenizeCpp);
            QArrayDataPointer<Symbol>::operator=
                      ((QArrayDataPointer<Symbol> *)this,(QArrayDataPointer<Symbol> *)&sym);
            QArrayDataPointer<Symbol>::~QArrayDataPointer((QArrayDataPointer<Symbol> *)&sym);
            QByteArray::clear();
            (this->super_Parser).index = 0;
            Symbol::Symbol(&sym,0,MOC_INCLUDE_BEGIN,&local_f8.array);
            QList<Symbol>::emplaceBack<Symbol>(preprocessed,&sym);
            QArrayDataPointer<char>::~QArrayDataPointer(&sym.lex.d);
            preprocess(this,&local_f8.array,preprocessed);
            Symbol::Symbol(&sym,iVar9,MOC_INCLUDE_END,&local_f8.array);
            QList<Symbol>::emplaceBack<Symbol>(preprocessed,&sym);
            QArrayDataPointer<char>::~QArrayDataPointer(&sym.lex.d);
            QArrayDataPointer<Symbol>::operator=((QArrayDataPointer<Symbol> *)this,&local_90);
            (this->super_Parser).index = qVar3;
            QArrayDataPointer<Symbol>::~QArrayDataPointer(&local_90);
          }
          QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
        }
        QFile::~QFile((QFile *)&local_68);
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
    goto switchD_0012a1e0_caseD_a4;
  default:
    if (TVar8 - SIGNALS < 2) {
      sym.from = -0x5555555555555556;
      sym.len = -0x5555555555555556;
      sym.lex.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
      sym.lex.d.size = -0x5555555555555556;
      sym.lineNum = -0x55555556;
      sym.token = 0xaaaaaaaa;
      sym.lex.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
      Symbol::Symbol(&sym,(this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
      SubArray::SubArray(&local_f8,"QT_NO_KEYWORDS");
      bVar6 = QHash<SubArray,_Macro>::contains(this_00,&local_f8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_f8);
      TVar8 = TVar8 == SIGNALS ^ Q_SLOTS_TOKEN;
      if (bVar6) {
        TVar8 = IDENTIFIER;
      }
      sym.token = TVar8;
      QList<Symbol>::emplaceBack<Symbol_const&>(preprocessed,&sym);
      QArrayDataPointer<char>::~QArrayDataPointer(&sym.lex.d);
    }
    else if (TVar8 == IDENTIFIER) {
      sym.lineNum = 0;
      sym.token = NOTOKEN;
      macroExpand(preprocessed,this,(Symbols *)this,index,
                  (this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum,true,
                  (QSet<QByteArray> *)&sym);
      QHash<QByteArray,_QHashDummyValue>::~QHash((QHash<QByteArray,_QHashDummyValue> *)&sym);
    }
    else {
switchD_0012a1e0_caseD_a5:
      QList<Symbol>::emplaceBack<Symbol_const&>
                (preprocessed,(this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
    }
    goto switchD_0012a1e0_caseD_a4;
  }
  until(this,NEWLINE);
  goto switchD_0012a1e0_caseD_a4;
}

Assistant:

void Preprocessor::preprocess(const QByteArray &filename, Symbols &preprocessed)
{
    currentFilenames.push(filename);
    preprocessed.reserve(preprocessed.size() + symbols.size());
    while (hasNext()) {
        Token token = next();

        switch (token) {
        case PP_INCLUDE:
        {
            int lineNum = symbol().lineNum;
            QByteArray include;
            bool local = false;
            if (test(PP_STRING_LITERAL)) {
                local = lexem().startsWith('\"');
                include = unquotedLexem();
            } else
                continue;
            until(PP_NEWLINE);

            include = resolveInclude(include, local ? filename : QByteArray());
            if (include.isNull())
                continue;

            if (Preprocessor::preprocessedIncludes.contains(include))
                continue;
            Preprocessor::preprocessedIncludes.insert(include);

            QFile file(QString::fromLocal8Bit(include.constData()));
            if (!file.open(QFile::ReadOnly))
                continue;

            QByteArray input = readOrMapFile(&file);

            file.close();
            if (input.isEmpty())
                continue;

            Symbols saveSymbols = symbols;
            qsizetype saveIndex = index;

            // phase 1: get rid of backslash-newlines
            input = cleaned(input);

            // phase 2: tokenize for the preprocessor
            symbols = tokenize(input);
            input.clear();

            index = 0;

            // phase 3: preprocess conditions and substitute macros
            preprocessed += Symbol(0, MOC_INCLUDE_BEGIN, include);
            preprocess(include, preprocessed);
            preprocessed += Symbol(lineNum, MOC_INCLUDE_END, include);

            symbols = saveSymbols;
            index = saveIndex;
            continue;
        }
        case PP_DEFINE:
        {
            next();
            QByteArray name = lexem();
            if (name.isEmpty() || !is_ident_start(name[0]))
                error();
            Macro macro;
            macro.isVariadic = false;
            if (test(LPAREN)) {
                // we have a function macro
                macro.isFunction = true;
                parseDefineArguments(&macro);
            } else {
                macro.isFunction = false;
            }
            qsizetype start = index;
            until(PP_NEWLINE);
            macro.symbols.reserve(index - start - 1);

            // remove whitespace where there shouldn't be any:
            // Before and after the macro, after a # and around ##
            Token lastToken = HASH; // skip shitespace at the beginning
            for (qsizetype i = start; i < index - 1; ++i) {
                Token token = symbols.at(i).token;
                if (token == WHITESPACE) {
                    if (lastToken == PP_HASH || lastToken == HASH ||
                        lastToken == PP_HASHHASH ||
                        lastToken == WHITESPACE)
                        continue;
                } else if (token == PP_HASHHASH) {
                    if (!macro.symbols.isEmpty() &&
                        lastToken == WHITESPACE)
                        macro.symbols.pop_back();
                }
                macro.symbols.append(symbols.at(i));
                lastToken = token;
            }
            // remove trailing whitespace
            while (!macro.symbols.isEmpty() &&
                   (macro.symbols.constLast().token == PP_WHITESPACE || macro.symbols.constLast().token == WHITESPACE))
                macro.symbols.pop_back();

            if (!macro.symbols.isEmpty()) {
                if (macro.symbols.constFirst().token == PP_HASHHASH ||
                    macro.symbols.constLast().token == PP_HASHHASH) {
                    error("'##' cannot appear at either end of a macro expansion");
                }
            }
            macros.insert(name, macro);
            continue;
        }
        case PP_UNDEF: {
            next();
            QByteArray name = lexem();
            until(PP_NEWLINE);
            macros.remove(name);
            continue;
        }
        case PP_IDENTIFIER: {
            // substitute macros
            macroExpand(&preprocessed, this, symbols, index, symbol().lineNum, true);
            continue;
        }
        case PP_HASH:
            until(PP_NEWLINE);
            continue; // skip unknown preprocessor statement
        case PP_IFDEF:
        case PP_IFNDEF:
        case PP_IF:
            while (!evaluateCondition()) {
                if (!skipBranch())
                    break;
                if (test(PP_ELIF)) {
                } else {
                    until(PP_NEWLINE);
                    break;
                }
            }
            continue;
        case PP_ELIF:
        case PP_ELSE:
            skipUntilEndif();
            Q_FALLTHROUGH();
        case PP_ENDIF:
            until(PP_NEWLINE);
            continue;
        case PP_NEWLINE:
            continue;
        case SIGNALS:
        case SLOTS: {
            Symbol sym = symbol();
            if (macros.contains("QT_NO_KEYWORDS"))
                sym.token = IDENTIFIER;
            else
                sym.token = (token == SIGNALS ? Q_SIGNALS_TOKEN : Q_SLOTS_TOKEN);
            preprocessed += sym;
        } continue;
        default:
            break;
        }
        preprocessed += symbol();
    }

    currentFilenames.pop();
}